

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

uint8_t message_color(uint16_t age)

{
  message_t *pmVar1;
  msgcolor_t *pmVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  undefined6 in_register_0000003a;
  
  pmVar1 = messages->head;
  iVar4 = (int)CONCAT62(in_register_0000003a,age);
  if (iVar4 != 0 && pmVar1 != (message_t *)0x0) {
    uVar5 = iVar4 - 1;
    do {
      pmVar1 = pmVar1->older;
      sVar3 = (short)uVar5;
      uVar5 = (uint)(ushort)(sVar3 - 1);
      if (pmVar1 == (_message_t *)0x0) break;
    } while (sVar3 != 0);
  }
  if ((pmVar1 != (_message_t *)0x0) && (pmVar2 = messages->colors, pmVar2 != (msgcolor_t *)0x0)) {
    do {
      if (pmVar2->type == pmVar1->type) {
        return pmVar2->color + (pmVar2->color == '\0');
      }
      pmVar2 = pmVar2->next;
    } while (pmVar2 != (_msgcolor_t *)0x0);
  }
  return '\x01';
}

Assistant:

uint8_t message_color(uint16_t age)
{
	message_t *m = message_get(age);
	return (m ? message_type_color(m->type) : COLOUR_WHITE);
}